

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq_word_validation_test.c
# Opt level: O1

_Bool is_acceptable(automaton *a,char state)

{
  long lVar1;
  uint uVar2;
  size_t sVar3;
  long lVar4;
  bool bVar5;
  
  sVar3 = strlen(a->acceptable_states);
  uVar2 = (uint)sVar3;
  bVar5 = 0 < (int)uVar2;
  if ((0 < (int)uVar2) && (a->acceptable_states[0] != state)) {
    lVar1 = 0;
    do {
      lVar4 = lVar1;
      if ((ulong)(uVar2 & 0x7fffffff) - 1 == lVar4) break;
      lVar1 = lVar4 + 1;
    } while (a->acceptable_states[lVar4 + 1] != state);
    bVar5 = lVar4 + 1U < (ulong)(uVar2 & 0x7fffffff);
  }
  return bVar5;
}

Assistant:

bool is_acceptable(const automaton * a, char state) {
    assert(state >= 0 + STR_STORAGE_VAL_OFFSET);
    assert(state < a->states_size + STR_STORAGE_VAL_OFFSET);

    size_t acceptable_states_length = strlen(a->acceptable_states);
    int i;
    for(i=0; i<(int)acceptable_states_length; i++) {
        if(a->acceptable_states[i] == state) {
            return true;
        }
    }
    assert(i == acceptable_states_length);
    return false;
}